

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_relationship *
mg_relationship_make(int64_t id,int64_t start_id,int64_t end_id,mg_string *type,mg_map *properties)

{
  mg_string *in_RCX;
  int64_t in_RDX;
  int64_t in_RSI;
  int64_t in_RDI;
  mg_map *in_R8;
  mg_relationship *rel;
  size_t in_stack_ffffffffffffffc8;
  mg_relationship *local_8;
  
  local_8 = (mg_relationship *)mg_allocator_malloc((mg_allocator *)in_R8,in_stack_ffffffffffffffc8);
  if (local_8 == (mg_relationship *)0x0) {
    local_8 = (mg_relationship *)0x0;
  }
  else {
    local_8->id = in_RDI;
    local_8->start_id = in_RSI;
    local_8->end_id = in_RDX;
    local_8->type = in_RCX;
    local_8->properties = in_R8;
  }
  return local_8;
}

Assistant:

mg_relationship *mg_relationship_make(int64_t id, int64_t start_id,
                                      int64_t end_id, mg_string *type,
                                      mg_map *properties) {
  mg_relationship *rel =
      mg_allocator_malloc(&mg_system_allocator, sizeof(mg_relationship));
  if (!rel) {
    return NULL;
  }
  rel->id = id;
  rel->start_id = start_id;
  rel->end_id = end_id;
  rel->type = type;
  rel->properties = properties;
  return rel;
}